

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall enact::Parser::synchronise(Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  Parser *this_local;
  
  advance(this);
  while ((((bVar2 = isAtEnd(this), ((bVar2 ^ 0xffU) & 1) != 0 &&
           (TVar1 = (this->m_current).type, TVar1 != ENUM)) && (1 < TVar1 - FUNC)) &&
         (((1 < TVar1 - IMM && (TVar1 != MUT)) && ((TVar1 != STRUCT && (TVar1 != TRAIT))))))) {
    advance(this);
  }
  return;
}

Assistant:

void Parser::synchronise() {
        advance();

        while (!isAtEnd()) {
            switch (m_current.type) {
                case TokenType::ENUM:
                case TokenType::FOR:
                case TokenType::FUNC:
                case TokenType::IMM:
                case TokenType::IMPL:
                case TokenType::MUT:
                case TokenType::STRUCT:
                case TokenType::TRAIT:
                    return;
            }

            advance();
        }
    }